

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_std::pair<int,_int>_&>::Matcher
          (Matcher<const_std::pair<int,_int>_&> *this,pair<int,_int> *value)

{
  pair<int,_int> local_38;
  Matcher<const_std::pair<int,_int>_&> local_30;
  pair<int,_int> *local_18;
  pair<int,_int> *value_local;
  Matcher<const_std::pair<int,_int>_&> *this_local;
  
  local_18 = value;
  value_local = (pair<int,_int> *)this;
  internal::MatcherBase<const_std::pair<int,_int>_&>::MatcherBase
            (&this->super_MatcherBase<const_std::pair<int,_int>_&>);
  (this->super_MatcherBase<const_std::pair<int,_int>_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_002c3448;
  local_38 = (pair<int,_int>)Eq<std::pair<int,int>>(*local_18);
  Matcher<std::pair<int,int>const&>::Matcher<testing::internal::EqMatcher<std::pair<int,int>>,void>
            ((Matcher<std::pair<int,int>const&> *)&local_30,
             (EqMatcher<std::pair<int,_int>_> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}